

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O0

void __thiscall deqp::sl::ShaderParser::parseValueBlock(ShaderParser *this,ValueBlock *valueBlock)

{
  size_type sVar1;
  reference pvVar2;
  Value *val;
  int local_48;
  int valueNdx;
  int arrayLength;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ValueBlock *local_18;
  ValueBlock *valueBlock_local;
  ShaderParser *this_local;
  
  local_18 = valueBlock;
  valueBlock_local = (ValueBlock *)this;
  advanceToken(this,TOKEN_VALUES);
  advanceToken(this,TOKEN_LEFT_BRACE);
  while( true ) {
    while (((this->m_curToken == TOKEN_UNIFORM || (this->m_curToken == TOKEN_INPUT)) ||
           (this->m_curToken == TOKEN_OUTPUT))) {
      parseValue(this,local_18);
    }
    if (this->m_curToken == TOKEN_RIGHT_BRACE) break;
    std::operator+(&local_38,"unexpected token when parsing a value block: ",&this->m_curTokenStr);
    parseError(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  advanceToken(this,TOKEN_RIGHT_BRACE);
  local_48 = 1;
  for (val._4_4_ = 0;
      sVar1 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
              ::size(&local_18->values), val._4_4_ < (int)sVar1; val._4_4_ = val._4_4_ + 1) {
    pvVar2 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ::operator[](&local_18->values,(long)val._4_4_);
    if (1 < pvVar2->arrayLength) {
      local_48 = pvVar2->arrayLength;
    }
  }
  local_18->arrayLength = local_48;
  return;
}

Assistant:

void ShaderParser::parseValueBlock(ShaderCase::ValueBlock& valueBlock)
{
	PARSE_DBG(("    parseValueBlock()\n"));
	advanceToken(TOKEN_VALUES);
	advanceToken(TOKEN_LEFT_BRACE);

	for (;;)
	{
		if (m_curToken == TOKEN_UNIFORM || m_curToken == TOKEN_INPUT || m_curToken == TOKEN_OUTPUT)
			parseValue(valueBlock);
		else if (m_curToken == TOKEN_RIGHT_BRACE)
			break;
		else
			parseError(string("unexpected token when parsing a value block: " + m_curTokenStr));
	}

	advanceToken(TOKEN_RIGHT_BRACE);

	// Compute combined array length of value block.
	int arrayLength = 1;
	for (int valueNdx = 0; valueNdx < (int)valueBlock.values.size(); valueNdx++)
	{
		const ShaderCase::Value& val = valueBlock.values[valueNdx];
		if (val.arrayLength > 1)
		{
			DE_ASSERT(arrayLength == 1 || arrayLength == val.arrayLength);
			arrayLength = val.arrayLength;
		}
	}
	valueBlock.arrayLength = arrayLength;
}